

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.h
# Opt level: O1

void test_dsStack_store(void)

{
  undefined4 in_EAX;
  int iVar1;
  uint uVar2;
  undefined4 in_register_00000004;
  long lVar3;
  void *data;
  
  iVar1 = ds_stack_counts(stack);
  lVar3 = 0;
  UnityAssertEqualNumber((long)iVar1,0,"unexpected counts!",0x3b,UNITY_DISPLAY_STYLE_INT);
  do {
    ds_stack_push(stack,(long)&DAT_00103134 + (long)*(int *)((long)&DAT_00103134 + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  uVar2 = ds_stack_pop(stack);
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x41,UNITY_DISPLAY_STYLE_INT);
  iVar1 = strcmp((char *)CONCAT44(in_register_00000004,in_EAX),"three");
  if (iVar1 != 0) {
    UnityFail(" Expected TRUE Was FALSE",0x42);
  }
  uVar2 = ds_stack_clear(stack);
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x44,UNITY_DISPLAY_STYLE_INT);
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,0,"unexpected counts!",0x45,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

UNITY_WEAK_ATTRIBUTE void setUp(void) { }